

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O0

int D_GenderToInt(char *gender)

{
  int iVar1;
  char *gender_local;
  
  iVar1 = strcasecmp(gender,"female");
  if (iVar1 == 0) {
    gender_local._4_4_ = 1;
  }
  else {
    iVar1 = strcasecmp(gender,"other");
    if ((iVar1 != 0) && (iVar1 = strcasecmp(gender,"cyborg"), iVar1 != 0)) {
      return 0;
    }
    gender_local._4_4_ = 2;
  }
  return gender_local._4_4_;
}

Assistant:

int D_GenderToInt (const char *gender)
{
	if (!stricmp (gender, "female"))
		return GENDER_FEMALE;
	else if (!stricmp (gender, "other") || !stricmp (gender, "cyborg"))
		return GENDER_NEUTER;
	else
		return GENDER_MALE;
}